

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float __thiscall
tcu::Texture2DArrayView::sampleCompare
          (Texture2DArrayView *this,Sampler *sampler,float ref,float s,float t,float r,float lod)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  float fVar1;
  IVec3 local_24;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  local_24.m_data[2] = selectLayer(this,r);
  local_24.m_data[0] = 0;
  local_24.m_data[1] = 0;
  fVar1 = sampleLevelArray2DCompare(levels,numLevels,sampler,ref,s,t,lod,&local_24);
  return fVar1;
}

Assistant:

float Texture2DArrayView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float r, float lod) const
{
	return sampleLevelArray2DCompare(m_levels, m_numLevels, sampler, ref, s, t, lod, IVec3(0, 0, selectLayer(r)));
}